

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_minnow_byt_compatible.c
# Opt level: O1

mraa_board_t * mraa_intel_minnowboard_byt_compatible(mraa_boolean_t turbot)

{
  int iVar1;
  undefined4 uVar2;
  mraa_result_t mVar3;
  mraa_board_t *board;
  mraa_pininfo_t *pmVar4;
  mraa_adv_func_t *pmVar5;
  char *pcVar6;
  long lVar7;
  undefined4 uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  long lVar16;
  int pin_index_scl;
  int pin_index_sda;
  int uname_minor;
  int uname_major;
  utsname running_uname;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  utsname local_1ae;
  
  board = (mraa_board_t *)calloc(1,0x5f0);
  if (board != (mraa_board_t *)0x0) {
    board->platform_name = "MinnowBoard MAX";
    pcVar6 = "Turbot";
    if (turbot == 0) {
      pcVar6 = "Ax";
    }
    uVar10 = (turbot != 0) + 0x1b;
    board->platform_version = pcVar6;
    board->phy_pin_count = uVar10;
    board->gpio_count = uVar10;
    board->chardev_capable = 1;
    pmVar4 = (mraa_pininfo_t *)calloc((ulong)uVar10,0x2f4);
    board->pins = pmVar4;
    if (pmVar4 != (mraa_pininfo_t *)0x0) {
      pmVar5 = (mraa_adv_func_t *)calloc(1,0x288);
      board->adv_func = pmVar5;
      if (pmVar5 != (mraa_adv_func_t *)0x0) {
        iVar1 = uname(&local_1ae);
        if (iVar1 == 0) {
          __isoc99_sscanf(local_1ae.release,"%d.%d",&local_1b4);
          if ((local_1b4 < 4) && (local_1b8 < 0x12)) {
            arch_nr_gpios_adjust = 0;
          }
          if (0 < board->phy_pin_count) {
            pmVar4 = board->pins;
            builtin_strncpy(pmVar4->name,"INVALID",8);
            *(undefined1 *)&pmVar4->capabilities = 0;
            (pmVar4->capabilities).field_0x3 = 0;
            *(undefined2 *)&(pmVar4->capabilities).field_0x1 = 0;
          }
          if (1 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[1].name[0] = 'G';
            pmVar4[1].name[1] = 'N';
            pmVar4[1].name[2] = 'D';
            pmVar4[1].name[3] = '\0';
            pmVar4[1].name[4] = '\0';
            pmVar4[1].name[5] = '\0';
            pmVar4[1].name[6] = '\0';
            pmVar4[1].name[7] = '\0';
            *(undefined1 *)&pmVar4[1].capabilities = 0;
            pmVar4[1].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[1].capabilities.field_0x1 = 0;
          }
          if (2 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[2].name[0] = 'G';
            pmVar4[2].name[1] = 'N';
            pmVar4[2].name[2] = 'D';
            pmVar4[2].name[3] = '\0';
            pmVar4[2].name[4] = '\0';
            pmVar4[2].name[5] = '\0';
            pmVar4[2].name[6] = '\0';
            pmVar4[2].name[7] = '\0';
            *(undefined1 *)&pmVar4[2].capabilities = 0;
            pmVar4[2].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[2].capabilities.field_0x1 = 0;
          }
          if (3 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[3].name[0] = '5';
            pmVar4[3].name[1] = 'v';
            pmVar4[3].name[2] = '\0';
            pmVar4[3].name[3] = '\0';
            pmVar4[3].name[4] = '\0';
            pmVar4[3].name[5] = '\0';
            pmVar4[3].name[6] = '\0';
            pmVar4[3].name[7] = '\0';
            *(undefined1 *)&pmVar4[3].capabilities = 0;
            pmVar4[3].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[3].capabilities.field_0x1 = 0;
          }
          if (4 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[4].name[0] = '3';
            pmVar4[4].name[1] = '.';
            pmVar4[4].name[2] = '3';
            pmVar4[4].name[3] = 'v';
            pmVar4[4].name[4] = '\0';
            pmVar4[4].name[5] = '\0';
            pmVar4[4].name[6] = '\0';
            pmVar4[4].name[7] = '\0';
            *(undefined1 *)&pmVar4[4].capabilities = 0;
            pmVar4[4].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[4].capabilities.field_0x1 = 0;
          }
          if (5 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[5].name[0] = 'S';
            pmVar4[5].name[1] = 'P';
            pmVar4[5].name[2] = 'I';
            pmVar4[5].name[3] = '_';
            pmVar4[5].name[4] = 'C';
            pmVar4[5].name[5] = 'S';
            pmVar4[5].name[6] = '\0';
            pmVar4[5].name[7] = '\0';
            *(undefined1 *)&pmVar4[5].capabilities = 0x11;
            pmVar4[5].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[5].capabilities.field_0x1 = 0;
            pmVar4[5].spi.mux_total = 0;
          }
          if (6 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[6].name[0] = 'U';
            pmVar4[6].name[1] = 'A';
            pmVar4[6].name[2] = 'R';
            pmVar4[6].name[3] = 'T';
            pmVar4[6].name[4] = '1';
            pmVar4[6].name[5] = 'T';
            pmVar4[6].name[6] = 'X';
            pmVar4[6].name[7] = '\0';
            *(undefined1 *)&pmVar4[6].capabilities = 0x81;
            pmVar4[6].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[6].capabilities.field_0x1 = 0;
          }
          if (7 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[7].name[0] = 'S';
            pmVar4[7].name[1] = 'P';
            pmVar4[7].name[2] = 'I';
            pmVar4[7].name[3] = 'M';
            pmVar4[7].name[4] = 'I';
            pmVar4[7].name[5] = 'S';
            pmVar4[7].name[6] = 'O';
            pmVar4[7].name[7] = '\0';
            *(undefined1 *)&pmVar4[7].capabilities = 0x11;
            pmVar4[7].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[7].capabilities.field_0x1 = 0;
            pmVar4[7].spi.mux_total = 0;
          }
          if (8 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[8].name[0] = 'U';
            pmVar4[8].name[1] = 'A';
            pmVar4[8].name[2] = 'R';
            pmVar4[8].name[3] = 'T';
            pmVar4[8].name[4] = '1';
            pmVar4[8].name[5] = 'R';
            pmVar4[8].name[6] = 'X';
            pmVar4[8].name[7] = '\0';
            *(undefined1 *)&pmVar4[8].capabilities = 0x81;
            pmVar4[8].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[8].capabilities.field_0x1 = 0;
          }
          if (9 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[9].name[0] = 'S';
            pmVar4[9].name[1] = 'P';
            pmVar4[9].name[2] = 'I';
            pmVar4[9].name[3] = 'M';
            pmVar4[9].name[4] = 'O';
            pmVar4[9].name[5] = 'S';
            pmVar4[9].name[6] = 'I';
            pmVar4[9].name[7] = '\0';
            *(undefined1 *)&pmVar4[9].capabilities = 0x11;
            pmVar4[9].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[9].capabilities.field_0x1 = 0;
            pmVar4[9].spi.mux_total = 0;
          }
          if (10 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[10].name[0] = 'U';
            pmVar4[10].name[1] = 'A';
            pmVar4[10].name[2] = 'R';
            pmVar4[10].name[3] = 'T';
            pmVar4[10].name[4] = '1';
            pmVar4[10].name[5] = 'C';
            pmVar4[10].name[6] = 'T';
            pmVar4[10].name[7] = '\0';
            *(undefined1 *)&pmVar4[10].capabilities = 3;
            pmVar4[10].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[10].capabilities.field_0x1 = 0;
            pmVar4[10].gpio.pinmap = arch_nr_gpios_adjust | 0xe3;
            pmVar4[10].gpio.mux_total = 0;
            pmVar4[10].gpio.gpio_chip = 0;
            pmVar4[10].gpio.gpio_line = 0x49;
          }
          if (0xb < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0xb].name[0] = 'S';
            pmVar4[0xb].name[1] = 'P';
            pmVar4[0xb].name[2] = 'I';
            pmVar4[0xb].name[3] = '_';
            pmVar4[0xb].name[4] = 'C';
            pmVar4[0xb].name[5] = 'L';
            pmVar4[0xb].name[6] = 'K';
            pmVar4[0xb].name[7] = '\0';
            *(undefined1 *)&pmVar4[0xb].capabilities = 0x11;
            pmVar4[0xb].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0xb].capabilities.field_0x1 = 0;
            pmVar4[0xb].spi.mux_total = 0;
          }
          if (0xc < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0xc].name[0] = 'U';
            pmVar4[0xc].name[1] = 'A';
            pmVar4[0xc].name[2] = 'R';
            pmVar4[0xc].name[3] = 'T';
            pmVar4[0xc].name[4] = '1';
            pmVar4[0xc].name[5] = 'R';
            pmVar4[0xc].name[6] = 'T';
            pmVar4[0xc].name[7] = '\0';
            *(undefined1 *)&pmVar4[0xc].capabilities = 3;
            pmVar4[0xc].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0xc].capabilities.field_0x1 = 0;
            pmVar4[0xc].gpio.pinmap = arch_nr_gpios_adjust | 0xe2;
            pmVar4[0xc].gpio.mux_total = 0;
            pmVar4[0xc].gpio.gpio_chip = 0;
            pmVar4[0xc].gpio.gpio_line = 0x48;
          }
          if (0xd < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0xd].name[0] = 'I';
            pmVar4[0xd].name[1] = '2';
            pmVar4[0xd].name[2] = 'C';
            pmVar4[0xd].name[3] = '_';
            pmVar4[0xd].name[4] = 'S';
            pmVar4[0xd].name[5] = 'C';
            pmVar4[0xd].name[6] = 'L';
            pmVar4[0xd].name[7] = '\0';
            *(undefined1 *)&pmVar4[0xd].capabilities = 0x21;
            pmVar4[0xd].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0xd].capabilities.field_0x1 = 0;
            pmVar4[0xd].i2c.pinmap = 1;
            pmVar4[0xd].i2c.mux_total = 0;
          }
          if (0xe < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0xe].name[0] = 'I';
            pmVar4[0xe].name[1] = '2';
            pmVar4[0xe].name[2] = 'S';
            pmVar4[0xe].name[3] = '_';
            pmVar4[0xe].name[4] = 'C';
            pmVar4[0xe].name[5] = 'L';
            pmVar4[0xe].name[6] = 'K';
            pmVar4[0xe].name[7] = '\0';
            *(undefined1 *)&pmVar4[0xe].capabilities = 3;
            pmVar4[0xe].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0xe].capabilities.field_0x1 = 0;
            pmVar4[0xe].gpio.pinmap = arch_nr_gpios_adjust | 0xd8;
            pmVar4[0xe].gpio.mux_total = 0;
            pmVar4[0xe].gpio.gpio_chip = 0;
            pmVar4[0xe].gpio.gpio_line = 0x3e;
          }
          if (0xf < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0xf].name[0] = 'I';
            pmVar4[0xf].name[1] = '2';
            pmVar4[0xf].name[2] = 'C';
            pmVar4[0xf].name[3] = '_';
            pmVar4[0xf].name[4] = 'S';
            pmVar4[0xf].name[5] = 'D';
            pmVar4[0xf].name[6] = 'A';
            pmVar4[0xf].name[7] = '\0';
            *(undefined1 *)&pmVar4[0xf].capabilities = 0x21;
            pmVar4[0xf].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0xf].capabilities.field_0x1 = 0;
            pmVar4[0xf].i2c.pinmap = 1;
            pmVar4[0xf].i2c.mux_total = 0;
          }
          if (0x10 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0x10].name[0] = 'I';
            pmVar4[0x10].name[1] = '2';
            pmVar4[0x10].name[2] = 'S';
            pmVar4[0x10].name[3] = '_';
            pmVar4[0x10].name[4] = 'F';
            pmVar4[0x10].name[5] = 'R';
            pmVar4[0x10].name[6] = 'M';
            pmVar4[0x10].name[7] = '\0';
            *(undefined1 *)&pmVar4[0x10].capabilities = 3;
            pmVar4[0x10].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0x10].capabilities.field_0x1 = 0;
            pmVar4[0x10].gpio.pinmap = arch_nr_gpios_adjust | 0xd9;
            pmVar4[0x10].gpio.mux_total = 0;
            pmVar4[0x10].gpio.gpio_chip = 0;
            pmVar4[0x10].gpio.gpio_line = 0x3f;
          }
          if (0x11 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0x11].name[0] = 'U';
            pmVar4[0x11].name[1] = 'A';
            pmVar4[0x11].name[2] = 'R';
            pmVar4[0x11].name[3] = 'T';
            pmVar4[0x11].name[4] = '2';
            pmVar4[0x11].name[5] = 'T';
            pmVar4[0x11].name[6] = 'X';
            pmVar4[0x11].name[7] = '\0';
            *(undefined1 *)&pmVar4[0x11].capabilities = 0x81;
            pmVar4[0x11].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0x11].capabilities.field_0x1 = 0;
          }
          if (0x12 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0x12].name[0] = 'I';
            pmVar4[0x12].name[1] = '2';
            pmVar4[0x12].name[2] = 'S';
            pmVar4[0x12].name[3] = '_';
            pmVar4[0x12].name[4] = 'D';
            pmVar4[0x12].name[5] = 'O';
            pmVar4[0x12].name[6] = '\0';
            pmVar4[0x12].name[7] = '\0';
            *(undefined1 *)&pmVar4[0x12].capabilities = 3;
            pmVar4[0x12].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0x12].capabilities.field_0x1 = 0;
            pmVar4[0x12].gpio.pinmap = arch_nr_gpios_adjust | 0xdb;
            pmVar4[0x12].gpio.mux_total = 0;
            pmVar4[0x12].gpio.gpio_chip = 0;
            pmVar4[0x12].gpio.gpio_line = 0x41;
          }
          if (0x13 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0x13].name[0] = 'U';
            pmVar4[0x13].name[1] = 'A';
            pmVar4[0x13].name[2] = 'R';
            pmVar4[0x13].name[3] = 'T';
            pmVar4[0x13].name[4] = '2';
            pmVar4[0x13].name[5] = 'R';
            pmVar4[0x13].name[6] = 'X';
            pmVar4[0x13].name[7] = '\0';
            *(undefined1 *)&pmVar4[0x13].capabilities = 0x81;
            pmVar4[0x13].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0x13].capabilities.field_0x1 = 0;
          }
          if (0x14 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0x14].name[0] = 'I';
            pmVar4[0x14].name[1] = '2';
            pmVar4[0x14].name[2] = 'S';
            pmVar4[0x14].name[3] = '_';
            pmVar4[0x14].name[4] = 'D';
            pmVar4[0x14].name[5] = 'I';
            pmVar4[0x14].name[6] = '\0';
            pmVar4[0x14].name[7] = '\0';
            *(undefined1 *)&pmVar4[0x14].capabilities = 3;
            pmVar4[0x14].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0x14].capabilities.field_0x1 = 0;
            pmVar4[0x14].gpio.pinmap = arch_nr_gpios_adjust | 0xda;
            pmVar4[0x14].gpio.mux_total = 0;
            pmVar4[0x14].gpio.gpio_chip = 0;
            pmVar4[0x14].gpio.gpio_line = 0x40;
          }
          if (0x15 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0x15].name[0] = 'S';
            pmVar4[0x15].name[1] = '5';
            pmVar4[0x15].name[2] = '_';
            pmVar4[0x15].name[3] = '0';
            pmVar4[0x15].name[4] = '\0';
            pmVar4[0x15].name[5] = '\0';
            pmVar4[0x15].name[6] = '\0';
            pmVar4[0x15].name[7] = '\0';
            *(undefined1 *)&pmVar4[0x15].capabilities = 3;
            pmVar4[0x15].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0x15].capabilities.field_0x1 = 0;
            pmVar4[0x15].gpio.pinmap = arch_nr_gpios_adjust | 0x52;
            pmVar4[0x15].gpio.mux_total = 0;
            pmVar4[0x15].gpio.gpio_chip = 2;
            pmVar4[0x15].gpio.gpio_line = 0;
          }
          mraa_intel_minnowboard_set_pininfo
                    (board,0x16,"PWM0",(mraa_pincapabilities_t)0x5,0xf8,0,0x5e);
          if (0x17 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0x17].name[0] = 'S';
            pmVar4[0x17].name[1] = '5';
            pmVar4[0x17].name[2] = '_';
            pmVar4[0x17].name[3] = '1';
            pmVar4[0x17].name[4] = '\0';
            pmVar4[0x17].name[5] = '\0';
            pmVar4[0x17].name[6] = '\0';
            pmVar4[0x17].name[7] = '\0';
            *(undefined1 *)&pmVar4[0x17].capabilities = 3;
            pmVar4[0x17].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0x17].capabilities.field_0x1 = 0;
            pmVar4[0x17].gpio.pinmap = arch_nr_gpios_adjust | 0x53;
            pmVar4[0x17].gpio.mux_total = 0;
            pmVar4[0x17].gpio.gpio_chip = 2;
            pmVar4[0x17].gpio.gpio_line = 1;
          }
          mraa_intel_minnowboard_set_pininfo
                    (board,0x18,"PWM1",(mraa_pincapabilities_t)0x5,0xf9,0,0x5f);
          if (0x19 < board->phy_pin_count) {
            pmVar4 = board->pins;
            pmVar4[0x19].name[0] = 'S';
            pmVar4[0x19].name[1] = '5';
            pmVar4[0x19].name[2] = '_';
            pmVar4[0x19].name[3] = '4';
            pmVar4[0x19].name[4] = '\0';
            pmVar4[0x19].name[5] = '\0';
            pmVar4[0x19].name[6] = '\0';
            pmVar4[0x19].name[7] = '\0';
            *(undefined1 *)&pmVar4[0x19].capabilities = 3;
            pmVar4[0x19].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar4[0x19].capabilities.field_0x1 = 0;
            pmVar4[0x19].gpio.pinmap = arch_nr_gpios_adjust | 0x54;
            pmVar4[0x19].gpio.mux_total = 0;
            pmVar4[0x19].gpio.gpio_chip = 2;
            pmVar4[0x19].gpio.gpio_line = 2;
          }
          if (turbot == 0) {
            if (board->phy_pin_count < 0x1b) goto LAB_0011b11d;
            uVar2 = 0x36;
            lVar7 = 0x4d38;
            uVar8 = 0;
            lVar9 = 0x4d34;
            lVar11 = 0x4ce0;
            lVar12 = 0x4cd8;
            uVar10 = 0xd0;
            lVar13 = 0x4cd5;
            lVar14 = 0x4cd4;
            uVar15 = 0x343532384c4249;
            lVar16 = 0x4cc8;
          }
          else {
            if (0x1a < board->phy_pin_count) {
              pmVar4 = board->pins;
              pmVar4[0x1a].name[0] = 'I';
              pmVar4[0x1a].name[1] = '2';
              pmVar4[0x1a].name[2] = 'S';
              pmVar4[0x1a].name[3] = '_';
              pmVar4[0x1a].name[4] = 'M';
              pmVar4[0x1a].name[5] = 'C';
              pmVar4[0x1a].name[6] = 'L';
              pmVar4[0x1a].name[7] = 'K';
              *(undefined1 *)&pmVar4[0x1a].capabilities = 3;
              pmVar4[0x1a].capabilities.field_0x3 = 0;
              *(undefined2 *)&pmVar4[0x1a].capabilities.field_0x1 = 0;
              pmVar4[0x1a].gpio.pinmap = arch_nr_gpios_adjust | 0xfd;
              pmVar4[0x1a].gpio.mux_total = 0;
              pmVar4[0x1a].gpio.gpio_chip = 0;
              pmVar4[0x1a].gpio.gpio_line = 99;
            }
            if (board->phy_pin_count < 0x1c) goto LAB_0011b11d;
            uVar2 = 0x16;
            lVar7 = 0x502c;
            uVar8 = 2;
            lVar9 = 0x5028;
            lVar11 = 0x4fd4;
            lVar12 = 0x4fcc;
            uVar10 = 0x68;
            lVar13 = 0x4fc9;
            lVar14 = 0x4fc8;
            uVar15 = 0x44454c5f3244;
            lVar16 = 0x4fbc;
          }
          pmVar4 = board->pins;
          *(undefined8 *)(pmVar4->name + lVar16) = uVar15;
          pmVar4->name[lVar14] = '\x03';
          pmVar4->name[lVar13 + 2] = '\0';
          (pmVar4->name + lVar13)[0] = '\0';
          (pmVar4->name + lVar13)[1] = '\0';
          *(uint *)(pmVar4->name + lVar12) = uVar10 | arch_nr_gpios_adjust;
          pcVar6 = pmVar4->name + lVar11;
          pcVar6[0] = '\0';
          pcVar6[1] = '\0';
          pcVar6[2] = '\0';
          pcVar6[3] = '\0';
          *(undefined4 *)(pmVar4->name + lVar9) = uVar8;
          *(undefined4 *)(pmVar4->name + lVar7) = uVar2;
LAB_0011b11d:
          board->i2c_bus_count = 1;
          mVar3 = mraa_intel_minnowboard_get_pin_index(board,"I2C_SDA",&local_1bc);
          if ((mVar3 == MRAA_SUCCESS) &&
             (mVar3 = mraa_intel_minnowboard_get_pin_index(board,"I2C_SCL",&local_1c0),
             mVar3 == MRAA_SUCCESS)) {
            uVar10 = mraa_find_i2c_bus("designware",0);
            if (uVar10 == 0xffffffff) {
              board->i2c_bus_count = 0;
            }
            else {
              board->def_i2c_bus = uVar10;
              board->i2c_bus[0].bus_id = uVar10;
              board->i2c_bus[0].sda = local_1bc;
              board->i2c_bus[0].scl = local_1c0;
            }
          }
          board->pwm_default_period = 500;
          board->pwm_max_period = 1000000000;
          board->pwm_min_period = 1;
          board->spi_bus_count = 1;
          board->def_spi_bus = 0;
          board->spi_bus[0].bus_id = 0;
          board->spi_bus[0].slave_s = 0;
          board->spi_bus[0].miso = 7;
          board->spi_bus[0].cs = 5;
          board->spi_bus[0].sclk = 0xb;
          board->spi_bus[0].mosi = 9;
          board->uart_dev_count = 1;
          board->def_uart_dev = 0;
          board->uart_dev[0].rx = -1;
          board->uart_dev[0].tx = -1;
          board->uart_dev[0].device_path = "/dev/ttyS0";
          return board;
        }
        free(board->pins);
        pmVar4 = (mraa_pininfo_t *)board->adv_func;
      }
      free(pmVar4);
    }
    syslog(2,"minnowmax: Platform failed to initialise");
    free(board);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_minnowboard_byt_compatible(mraa_boolean_t turbot)
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));

    struct utsname running_uname;
    int uname_major, uname_minor;

    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    if (turbot) {
        b->platform_version = "Turbot";
        b->gpio_count = b->phy_pin_count = MRAA_INTEL_MINNOW_TURBOT_PINCOUNT;
    } else {
        b->platform_version = "Ax";
        b->gpio_count = b->phy_pin_count = MRAA_INTEL_MINNOW_MAX_PINCOUNT;
    }
    b->chardev_capable = 1;

    b->pins = (mraa_pininfo_t*) calloc((size_t) b->phy_pin_count, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        goto error;
    }

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        goto error;
    }

    if (uname(&running_uname) != 0) {
        free(b->pins);
        free(b->adv_func);
        goto error;
    }

    sscanf(running_uname.release, "%d.%d", &uname_major, &uname_minor);

    /* if we are on Linux 3.17 or lower they use a 256 max and number the GPIOs down
     * if we are on 3.18 or higher (ea584595fc85e65796335033dfca25ed655cd0ed)  (for now)
     * they start at 512 and number down, at some point this is going to change again when
     * GPIO moves to a radix.
     */
    if (uname_major <= 3 && uname_minor <= 17) {
        arch_nr_gpios_adjust = 0;
    }

    mraa_intel_minnowboard_set_pininfo(b, 0, "INVALID", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 1, "GND", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 2, "GND", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 3, "5v", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 4, "3.3v", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 5, "SPI_CS", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 220, 0, 66);
    mraa_intel_minnowboard_set_pininfo(b, 6, "UART1TX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 225, 0, 71);
    mraa_intel_minnowboard_set_pininfo(b, 7, "SPIMISO", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 221, 0, 67);
    mraa_intel_minnowboard_set_pininfo(b, 8, "UART1RX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 224, 0, 70);
    mraa_intel_minnowboard_set_pininfo(b, 9, "SPIMOSI", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 222, 0, 68);
    mraa_intel_minnowboard_set_pininfo(b, 10, "UART1CT", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 227, 0, 73);
    mraa_intel_minnowboard_set_pininfo(b, 11, "SPI_CLK", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 223, 0, 69);
    mraa_intel_minnowboard_set_pininfo(b, 12, "UART1RT", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 226, 0, 72);
    mraa_intel_minnowboard_set_pininfo(b, 13, "I2C_SCL", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, 243, 0, 89);
    mraa_intel_minnowboard_set_pininfo(b, 14, "I2S_CLK", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 216, 0, 62);
    mraa_intel_minnowboard_set_pininfo(b, 15, "I2C_SDA", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, 242, 0, 88);
    mraa_intel_minnowboard_set_pininfo(b, 16, "I2S_FRM", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 217, 0, 63);
    mraa_intel_minnowboard_set_pininfo(b, 17, "UART2TX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 229, 0, 75);
    mraa_intel_minnowboard_set_pininfo(b, 18, "I2S_DO", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 219, 0, 65);
    mraa_intel_minnowboard_set_pininfo(b, 19, "UART2RX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 228, 0, 74);
    mraa_intel_minnowboard_set_pininfo(b, 20, "I2S_DI", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 218, 0, 64);
    mraa_intel_minnowboard_set_pininfo(b, 21, "S5_0", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 82, 2, 0);
    mraa_intel_minnowboard_set_pininfo(b, 22, "PWM0", (mraa_pincapabilities_t){ 1, 0, 1, 0, 0, 0, 0, 0 },
                     248, 0, 94); // Assume BIOS configured for PWM
    mraa_intel_minnowboard_set_pininfo(b, 23, "S5_1", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 83, 2, 1);
    mraa_intel_minnowboard_set_pininfo(b, 24, "PWM1", (mraa_pincapabilities_t){ 1, 0, 1, 0, 0, 0, 0, 0 },
                     249, 0, 95); // Assume BIOS configured for PWM
    mraa_intel_minnowboard_set_pininfo(b, 25, "S5_4", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 84, 2, 2);
    if (turbot) {
        mraa_intel_minnowboard_set_pininfo(b, 26, "I2S_MCLK", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 253, 0, 99);
        mraa_intel_minnowboard_set_pininfo(b, 27, "D2_LED", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 104, 2, 22);
    } else {
        mraa_intel_minnowboard_set_pininfo(b, 26, "IBL8254", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 208, 0, 54);
    }

    // Set number of i2c adaptors usable from userspace
    b->i2c_bus_count = 1;

    // Configure i2c adaptor #7 and make it the default
    int pin_index_sda, pin_index_scl;
    if (mraa_intel_minnowboard_get_pin_index(b, "I2C_SDA", &pin_index_sda) == MRAA_SUCCESS &&
        mraa_intel_minnowboard_get_pin_index(b, "I2C_SCL", &pin_index_scl) == MRAA_SUCCESS) {
        int bus = mraa_find_i2c_bus(I2CNAME, 0);
        if (bus == -1) {
            b->i2c_bus_count = 0;
        } else {
            b->def_i2c_bus = (unsigned int) bus;
            b->i2c_bus[0].bus_id = b->def_i2c_bus;
            b->i2c_bus[0].sda = pin_index_sda;
            b->i2c_bus[0].scl = pin_index_scl;
        }
    }

    // Configure PWM
    b->pwm_default_period = 500;
    b->pwm_max_period = 1000000000;
    b->pwm_min_period = 1;

    b->spi_bus_count = 1;
    b->def_spi_bus = 0;
    b->spi_bus[0].bus_id = 0;
    b->spi_bus[0].slave_s = 0;
    b->spi_bus[0].cs = 5;
    b->spi_bus[0].mosi = 9;
    b->spi_bus[0].miso = 7;
    b->spi_bus[0].sclk = 11;

    b->uart_dev_count = 1;
    b->def_uart_dev = 0;
    b->uart_dev[0].rx = -1;
    b->uart_dev[0].tx = -1;
    b->uart_dev[0].device_path = "/dev/ttyS0";

    return b;
error:
    syslog(LOG_CRIT, "minnowmax: Platform failed to initialise");
    free(b);
    return NULL;
}